

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::init
          (RandomSSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  int iVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  deUint32 dVar5;
  uint uVar6;
  deBool dVar7;
  uint uVar8;
  uint extraout_EAX;
  long *plVar9;
  BufferBlock *pBVar10;
  uint uVar11;
  size_type *psVar12;
  uint uVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ulong uVar16;
  float fVar17;
  string name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  VarType type;
  Random rnd;
  uint local_fc;
  string local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  BufferBlock *local_c0;
  int local_b4;
  BufferVar local_b0;
  int local_6c;
  ShaderInterface *local_68;
  ulong local_60;
  VarType local_58;
  deRandom local_40;
  
  deRandom_init(&local_40,this->m_seed);
  uVar13 = this->m_maxBlocks;
  dVar5 = deRandom_getUint32(&local_40);
  uVar16 = 0;
  uVar6 = dVar5 / uVar13;
  uVar13 = dVar5 % uVar13;
  if (uVar13 < 0x7fffffff) {
    local_b4 = uVar13 + 1;
    local_68 = &(this->super_SSBOLayoutCase).m_interface;
    do {
      paVar15 = &local_b0.m_name.field_2;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8.field_2._M_local_buf[4] = 'k';
      local_f8.field_2._M_allocated_capacity._0_4_ = 0x636f6c42;
      local_f8._M_string_length = 5;
      local_f8.field_2._M_local_buf[5] = '\0';
      plVar9 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f8,5,0,'\x01');
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b0.m_name.field_2._M_allocated_capacity = *psVar12;
        local_b0.m_name.field_2._8_8_ = plVar9[3];
        local_b0.m_name._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_b0.m_name.field_2._M_allocated_capacity = *psVar12;
        local_b0.m_name._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_b0.m_name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_c0 = bb::ShaderInterface::allocBlock(local_68,local_b0.m_name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.m_name._M_dataplus._M_p != paVar15) {
        operator_delete(local_b0.m_name._M_dataplus._M_p,
                        local_b0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_f8.field_2._M_local_buf[5],
                                          CONCAT14(local_f8.field_2._M_local_buf[4],
                                                   local_f8.field_2._M_allocated_capacity._0_4_))) +
                        1);
      }
      local_fc = 0;
      local_60 = uVar16;
      if (0 < this->m_maxInstances) {
        fVar17 = deRandom_getFloat(&local_40);
        if (fVar17 < 0.3) {
          iVar2 = this->m_maxInstances;
          dVar5 = deRandom_getUint32(&local_40);
          local_fc = dVar5 % (iVar2 + 1U);
        }
      }
      uVar13 = this->m_maxBlockMembers;
      dVar5 = deRandom_getUint32(&local_40);
      uVar13 = dVar5 % uVar13;
      if ((int)local_fc < 1) {
        dVar7 = deRandom_getBool(&local_40);
        if (dVar7 == 1) goto LAB_0149245b;
      }
      else {
        bb::BufferBlock::setArraySize(local_c0,local_fc);
LAB_0149245b:
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8.field_2._M_local_buf[4] = 'k';
        local_f8.field_2._M_allocated_capacity._0_4_ = 0x636f6c62;
        local_f8._M_string_length = 5;
        local_f8.field_2._M_local_buf[5] = '\0';
        plVar9 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f8,5,0,'\x01');
        local_b0.m_name._M_dataplus._M_p = (pointer)&local_b0.m_name.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_b0.m_name.field_2._M_allocated_capacity = *psVar12;
          local_b0.m_name.field_2._8_8_ = plVar9[3];
        }
        else {
          local_b0.m_name.field_2._M_allocated_capacity = *psVar12;
          local_b0.m_name._M_dataplus._M_p = (pointer)*plVar9;
        }
        _Var4._M_p = local_b0.m_name._M_dataplus._M_p;
        local_b0.m_name._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        psVar1 = &local_c0->m_instanceName;
        pcVar3 = (char *)(local_c0->m_instanceName)._M_string_length;
        strlen(local_b0.m_name._M_dataplus._M_p);
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)_Var4._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.m_name._M_dataplus._M_p != &local_b0.m_name.field_2) {
          operator_delete(local_b0.m_name._M_dataplus._M_p,
                          local_b0.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_f8.field_2._M_local_buf[5],
                                            CONCAT14(local_f8.field_2._M_local_buf[4],
                                                     local_f8.field_2._M_allocated_capacity._0_4_)))
                          + 1);
        }
      }
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (uint *)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_b0.m_name._M_dataplus._M_p = local_b0.m_name._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_d8,(iterator)0x0,(uint *)&local_b0);
      uVar6 = this->m_features;
      if ((uVar6 >> 8 & 1) != 0) {
        local_b0.m_name._M_dataplus._M_p._0_4_ = 2;
        if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b0);
        }
        else {
          *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 2;
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar6 = this->m_features;
      }
      if ((uVar6 >> 9 & 1) != 0) {
        local_b0.m_name._M_dataplus._M_p._0_4_ = 1;
        if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b0);
        }
        else {
          *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 1;
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar6 = this->m_features;
      }
      if ((uVar6 >> 10 & 1) != 0) {
        local_b0.m_name._M_dataplus._M_p._0_4_ = 4;
        if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b0);
        }
        else {
          *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 4;
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_b0.m_name._M_dataplus._M_p = local_b0.m_name._M_dataplus._M_p & 0xffffffff00000000;
      uVar14 = 1;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
                ((Random *)&local_40,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_b0,1);
      uVar6 = (uint)local_b0.m_name._M_dataplus._M_p;
      if ((this->m_features & 0x1000) != 0) {
        local_b0.m_name._M_dataplus._M_p = local_b0.m_name._M_dataplus._M_p & 0xffffffff00000000;
        uVar14 = 1;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)&local_40,
                   (uint *)Functional::(anonymous_namespace)::RandomSSBOLayoutCase::
                           generateBlock(de::Random&,unsigned_int)::matrixCandidates,
                   generateType::precisionCandidates,(uint *)&local_b0,1);
        uVar6 = uVar6 | (uint)local_b0.m_name._M_dataplus._M_p;
      }
      local_c0->m_flags = uVar6;
      pBVar10 = local_c0;
      if (uVar13 < 0x7fffffff) {
        local_6c = uVar13 + 1;
        this_00 = &local_c0->m_variables;
        uVar6 = 0;
        do {
          uVar8 = this->m_features;
          Functional::(anonymous_namespace)::genName_abi_cxx11_
                    (&local_f8,(_anonymous_namespace_ *)0x61,'z',(char)this->m_bufferVarNdx,
                     (int)uVar14);
          uVar14 = 1;
          generateType(&local_58,this,(Random *)&local_40,0,true,
                       (bool)((byte)(this->m_features >> 0xd) & 1 & uVar13 == uVar6));
          if ((uVar8 & 0x40) == 0) {
LAB_01492745:
            fVar17 = deRandom_getFloat(&local_40);
            if (fVar17 < 0.7) {
              fVar17 = deRandom_getFloat(&local_40);
              uVar11 = (uint)(fVar17 < 0.7) << 0xc;
              uVar8 = 0x800;
            }
            else {
              uVar8 = 0;
              uVar11 = 0x1000;
            }
          }
          else {
            fVar17 = deRandom_getFloat(&local_40);
            uVar11 = 0;
            uVar8 = 0;
            if (fVar17 < 0.85) goto LAB_01492745;
          }
          bb::BufferVar::BufferVar(&local_b0,local_f8._M_dataplus._M_p,&local_58,uVar11 | uVar8);
          std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::
          push_back(this_00,&local_b0);
          glu::VarType::~VarType(&local_b0.m_type);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.m_name._M_dataplus._M_p != &local_b0.m_name.field_2) {
            operator_delete(local_b0.m_name._M_dataplus._M_p,
                            local_b0.m_name.field_2._M_allocated_capacity + 1);
          }
          this->m_bufferVarNdx = this->m_bufferVarNdx + 1;
          glu::VarType::~VarType(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_f8.field_2._M_local_buf[5],
                                              CONCAT14(local_f8.field_2._M_local_buf[4],
                                                       local_f8.field_2._M_allocated_capacity._0_4_)
                                             )) + 1);
          }
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < local_6c);
        pBVar10 = (BufferBlock *)
                  (local_c0->m_variables).
                  super__Vector_base<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (((*(int *)&pBVar10[-1].m_lastUnsizedArraySizes.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start == 1) &&
            (*(int *)&pBVar10[-1].m_lastUnsizedArraySizes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage == -1)) &&
           (local_fc = local_fc + (local_fc == 0), 0 < (int)local_fc)) {
          uVar16 = 0;
          do {
            iVar2 = this->m_maxArrayLength;
            dVar5 = deRandom_getUint32(&local_40);
            pBVar10 = (BufferBlock *)
                      (local_c0->m_lastUnsizedArraySizes).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            *(uint *)((long)&(pBVar10->m_blockName)._M_dataplus._M_p + uVar16 * 4) =
                 dVar5 % (iVar2 + 1U);
            uVar16 = uVar16 + 1;
          } while (local_fc != uVar16);
        }
      }
      uVar6 = (uint)pBVar10;
      this->m_blockNdx = this->m_blockNdx + 1;
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar6 = extraout_EAX;
      }
      uVar13 = (int)local_60 + 1;
      uVar16 = (ulong)uVar13;
    } while ((int)uVar13 < local_b4);
  }
  return uVar6;
}

Assistant:

void RandomSSBOLayoutCase::init (void)
{
	de::Random rnd(m_seed);

	const int numBlocks = rnd.getInt(1, m_maxBlocks);

	for (int ndx = 0; ndx < numBlocks; ndx++)
		generateBlock(rnd, 0);
}